

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  InternalKeyComparator *pIVar1;
  VersionSet *pVVar2;
  pointer ppFVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  Slice local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = this->grandparent_index_;
  pVVar2 = this->input_version_->vset_;
  pIVar1 = &pVVar2->icmp_;
  while (ppFVar3 = (this->grandparents_).
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->grandparents_).
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3)) {
    local_40 = InternalKey::Encode(&ppFVar3[uVar7]->largest);
    iVar6 = (*(pIVar1->super_Comparator)._vptr_Comparator[2])(pIVar1,internal_key,&local_40);
    if (iVar6 < 1) break;
    if (this->seen_key_ == true) {
      this->overlapped_bytes_ =
           this->overlapped_bytes_ +
           (this->grandparents_).
           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->grandparent_index_]->file_size;
    }
    uVar7 = this->grandparent_index_ + 1;
    this->grandparent_index_ = uVar7;
  }
  this->seen_key_ = true;
  lVar4 = this->overlapped_bytes_;
  sVar5 = pVVar2->options_->max_file_size;
  lVar8 = sVar5 * 10;
  if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == (long)(lVar4 + sVar5 * -10) < 0) {
    this->overlapped_bytes_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == (long)(lVar4 + sVar5 * -10) < 0;
  }
  __stack_chk_fail();
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}